

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXswizzle(ValidationContext *this,uint8_t *data,uint32_t size)

{
  string_view string;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_type sVar2;
  char *args_1;
  unsigned_long *puVar3;
  IssueError *pIVar4;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  IssueWarning *in_stack_00000070;
  ValidationContext *in_stack_00000078;
  size_t i;
  string_view value;
  bool hasNull;
  size_t in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar5;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar6;
  char *in_stack_ffffffffffffff60;
  string local_70 [36];
  VkFormat in_stack_ffffffffffffffb4;
  unsigned_long *args;
  IssueError *in_stack_ffffffffffffffd0;
  IssueError *__str;
  IssueError *issue;
  ValidationContext *in_stack_ffffffffffffffd8;
  IssueError *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar7;
  
  in_RDI[0x117] = '\x01';
  uVar6 = false;
  if (in_EDX != 0) {
    uVar6 = in_RSI[in_EDX - 1] == '\0';
  }
  uVar7 = CONCAT13(uVar6,in_stack_ffffffffffffffe8);
  if ((bool)uVar6 == false) {
    error<>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  uVar5 = in_EDX;
  if ((uVar7 & 0x1000000) != 0) {
    uVar5 = in_EDX - 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8,in_RSI,
             (ulong)uVar5);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8);
  if (sVar2 != 4) {
    error<unsigned_int&>
              ((ValidationContext *)CONCAT44(in_EDX,uVar7),in_stack_ffffffffffffffe0,
               (uint *)in_stack_ffffffffffffffd8);
  }
  __str = (IssueError *)0x0;
  while( true ) {
    args = (unsigned_long *)0x4;
    issue = __str;
    args_1 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &stack0xffffffffffffffd8);
    puVar3 = std::min<unsigned_long>
                       ((unsigned_long *)&stack0xffffffffffffffc8,
                        (unsigned_long *)&stack0xffffffffffffffc0);
    if ((IssueError *)*puVar3 <= __str) break;
    pIVar4 = (IssueError *)
             std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8
                       );
    if (issue < pIVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar5,in_stack_ffffffffffffff40),(char *)__str);
      std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8,
                 (size_type)issue);
      string._M_str = in_stack_ffffffffffffff30;
      string._M_len = in_stack_ffffffffffffff28;
      bVar1 = contains(string,'\0');
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8,
                   (size_type)issue);
        error<unsigned_long&,char_const&>(in_stack_ffffffffffffffd8,issue,args,args_1);
      }
    }
    __str = (IssueError *)&(issue->super_Issue).field_0x1;
  }
  bVar1 = isFormatStencil(*(VkFormat *)(in_RDI + 0x44));
  if ((bVar1) || (bVar1 = isFormatDepth(*(VkFormat *)(in_RDI + 0x44)), bVar1)) {
    toString_abi_cxx11_(in_stack_ffffffffffffffb4);
    warning<std::__cxx11::string>(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    std::__cxx11::string::~string(local_70);
  }
  if ((in_RDI[0x29] & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(uVar5,in_stack_ffffffffffffff40),(char *)__str);
    __x._M_len._7_1_ = uVar6;
    __x._M_len._0_7_ = in_stack_ffffffffffffff58;
    __x._M_str = in_stack_ffffffffffffff60;
    __y._M_str = in_RDI;
    __y._M_len = (size_t)in_RSI;
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      error<std::basic_string_view<char,std::char_traits<char>>const&>
                ((ValidationContext *)CONCAT44(in_EDX,uVar7),in_stack_ffffffffffffffe0,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXswizzle(const uint8_t* data, uint32_t size) {
    foundKTXswizzle = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXswizzleMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != 4)
        error(Metadata::KTXswizzleInvalidSize, size);

    for (std::size_t i = 0; i < std::min(std::size_t{4}, value.size()); ++i) {
        if (value.size() > i && !contains("rgba01", value[i]))
            error(Metadata::KTXswizzleInvalidValue, i, value[i]);
    }

    if (isFormatStencil(VkFormat(header.vkFormat)) || isFormatDepth(VkFormat(header.vkFormat)))
        warning(Metadata::KTXswizzleWithDepthOrStencil, toString(VkFormat(header.vkFormat)));

    if (checkGLTFBasisU && value != "rgba")
        error(Metadata::KTXswizzleInvalidGLTFBU, value);
}